

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testYca.cpp
# Opt level: O0

void testYca(string *tempDir)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  void *this;
  _func_void_Array2D<Imf_2_5::Rgba>_ptr_int_int *in_stack_00000030;
  LineOrder in_stack_0000003c;
  LineOrder in_stack_00000040;
  RgbaChannels in_stack_00000044;
  Box2i *in_stack_00000048;
  char *in_stack_00000050;
  exception *e;
  int readOrder;
  int writeOrder;
  int i;
  int n;
  int maxThreads;
  Box2i dataWindow [6];
  string fileName;
  Box<Imath_2_5::Vec2<int>_> *in_stack_fffffffffffffe28;
  Box<Imath_2_5::Vec2<int>_> *in_stack_fffffffffffffe30;
  Vec2<int> *in_stack_fffffffffffffe38;
  Box<Imath_2_5::Vec2<int>_> *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  string *local_188;
  int local_16c;
  int local_168;
  int local_164;
  int local_160;
  Vec2<int> local_158;
  Vec2<int> local_150 [3];
  Vec2<int> local_138;
  Vec2<int> local_130 [3];
  Vec2<int> local_118;
  Vec2<int> local_110 [3];
  Vec2<int> local_f8;
  Vec2<int> local_f0 [3];
  Vec2<int> local_d8;
  Vec2<int> local_d0 [3];
  Vec2<int> local_b8;
  Vec2<int> local_b0 [3];
  string local_98 [96];
  string local_38 [56];
  
  poVar4 = std::operator<<((ostream *)&std::cout,"Testing luminance/chroma input and output");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::operator+(in_stack_fffffffffffffe58,
                 (char *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  local_188 = local_98;
  do {
    Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box(in_stack_fffffffffffffe30);
    local_188 = local_188 + 0x10;
  } while (local_188 != local_38);
  Imath_2_5::Vec2<int>::Vec2(local_b0,0,0);
  Imath_2_5::Vec2<int>::Vec2(&local_b8,1,0x11);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,&in_stack_fffffffffffffe30->min);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator=
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  Imath_2_5::Vec2<int>::Vec2(local_d0,0,0);
  Imath_2_5::Vec2<int>::Vec2(&local_d8,5,0x11);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,&in_stack_fffffffffffffe30->min);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator=
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  Imath_2_5::Vec2<int>::Vec2(local_f0,0,0);
  Imath_2_5::Vec2<int>::Vec2(&local_f8,0x11,1);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,&in_stack_fffffffffffffe30->min);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator=
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  Imath_2_5::Vec2<int>::Vec2(local_110,0,0);
  Imath_2_5::Vec2<int>::Vec2(&local_118,0x11,5);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,&in_stack_fffffffffffffe30->min);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator=
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  Imath_2_5::Vec2<int>::Vec2(local_130,0,0);
  Imath_2_5::Vec2<int>::Vec2(&local_138,1,1);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,&in_stack_fffffffffffffe30->min);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator=
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  Imath_2_5::Vec2<int>::Vec2(local_150,-0x12,-0x1c);
  Imath_2_5::Vec2<int>::Vec2(&local_158,0xf7,0xff);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,&in_stack_fffffffffffffe30->min);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator=
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  bVar1 = IlmThread_2_5::supportsThreads();
  iVar2 = 0;
  if ((bVar1 & 1) != 0) {
    iVar2 = 3;
  }
  for (local_160 = 0; local_160 <= iVar2; local_160 = local_160 + 1) {
    bVar1 = IlmThread_2_5::supportsThreads();
    if ((bVar1 & 1) != 0) {
      Imf_2_5::setGlobalThreadCount(0);
      poVar4 = std::operator<<((ostream *)&std::cout,"\nnumber of threads: ");
      iVar3 = Imf_2_5::globalThreadCount();
      this = (void *)std::ostream::operator<<(poVar4,iVar3);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
    for (local_164 = 0; local_164 < 6; local_164 = local_164 + 1) {
      for (local_168 = 0; local_168 < 2; local_168 = local_168 + 1) {
        for (local_16c = 0; local_16c < 3; local_16c = local_16c + 1) {
          std::__cxx11::string::c_str();
          anon_unknown.dwarf_20c50c::writeReadYca
                    (in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040,
                     in_stack_0000003c,in_stack_00000030);
          std::__cxx11::string::c_str();
          anon_unknown.dwarf_20c50c::writeReadYca
                    (in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040,
                     in_stack_0000003c,in_stack_00000030);
          std::__cxx11::string::c_str();
          anon_unknown.dwarf_20c50c::writeReadYca
                    (in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040,
                     in_stack_0000003c,in_stack_00000030);
          std::__cxx11::string::c_str();
          anon_unknown.dwarf_20c50c::writeReadYca
                    (in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040,
                     in_stack_0000003c,in_stack_00000030);
        }
      }
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void
testYca (const std::string &tempDir)
{
    try
    {
        cout << "Testing luminance/chroma input and output" << endl;

	std::string fileName = tempDir + "imf_test_yca.exr";

	Box2i dataWindow[6];
	dataWindow[0] = Box2i (V2i (0, 0), V2i (1, 17));
	dataWindow[1] = Box2i (V2i (0, 0), V2i (5, 17));
	dataWindow[2] = Box2i (V2i (0, 0), V2i (17, 1));
	dataWindow[3] = Box2i (V2i (0, 0), V2i (17, 5));
	dataWindow[4] = Box2i (V2i (0, 0), V2i (1, 1));
	dataWindow[5] = Box2i (V2i (-18, -28), V2i (247, 255));

	int maxThreads = ILMTHREAD_NAMESPACE::supportsThreads()? 3: 0;

	for (int n = 0; n <= maxThreads; ++n)
	{
	    if (ILMTHREAD_NAMESPACE::supportsThreads())
	    {
		setGlobalThreadCount (n);
		cout << "\nnumber of threads: " << globalThreadCount() << endl;
	    }

	    for (int i = 0; i < 6; ++i)
	    {
		for (int writeOrder = INCREASING_Y;
		     writeOrder <= DECREASING_Y;
		     ++writeOrder)
		{
		    for (int readOrder = INCREASING_Y;
			 readOrder <= RANDOM_Y;
			 ++readOrder)
		    {
			writeReadYca (fileName.c_str(), dataWindow[i],
				      WRITE_YCA,
				      LineOrder (writeOrder),
				      LineOrder (readOrder),
				      fillPixelsColor);

			writeReadYca (fileName.c_str(), dataWindow[i],
				      WRITE_YC,
				      LineOrder (writeOrder),
				      LineOrder (readOrder),
				      fillPixelsColor);

			writeReadYca (fileName.c_str(), dataWindow[i],
				      WRITE_YA,
				      LineOrder (writeOrder),
				      LineOrder (readOrder),
				      fillPixelsGray);

			writeReadYca (fileName.c_str(), dataWindow[i],
				      WRITE_Y,
				      LineOrder (writeOrder),
				      LineOrder (readOrder),
				      fillPixelsGray);
		    }
		}
	    }
	}

	cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
	cerr << "ERROR -- caught exception: " << e.what() << endl;
	assert (false);
    }
}